

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

StyleProp * InsertProperty(TidyDocImpl *doc,StyleProp *props,ctmbstr name,ctmbstr value)

{
  int iVar1;
  tmbstr ptVar2;
  int cmp;
  StyleProp *prop;
  StyleProp *prev;
  StyleProp *first;
  ctmbstr value_local;
  ctmbstr name_local;
  StyleProp *props_local;
  TidyDocImpl *doc_local;
  
  prop = (StyleProp *)0x0;
  name_local = (ctmbstr)props;
  while( true ) {
    if (name_local == (ctmbstr)0x0) {
      prev = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
      ptVar2 = prvTidytmbstrdup(doc->allocator,name);
      prev->name = ptVar2;
      ptVar2 = prvTidytmbstrdup(doc->allocator,value);
      prev->value = ptVar2;
      prev->next = (StyleProp *)0x0;
      if (prop != (StyleProp *)0x0) {
        prop->next = prev;
        prev = props;
      }
      return prev;
    }
    iVar1 = prvTidytmbstrcmp(*(ctmbstr *)name_local,name);
    if (iVar1 == 0) break;
    if (0 < iVar1) {
      prev = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
      ptVar2 = prvTidytmbstrdup(doc->allocator,name);
      prev->name = ptVar2;
      ptVar2 = prvTidytmbstrdup(doc->allocator,value);
      prev->value = ptVar2;
      prev->next = (StyleProp *)name_local;
      if (prop != (StyleProp *)0x0) {
        prop->next = prev;
        prev = props;
      }
      return prev;
    }
    prop = (StyleProp *)name_local;
    name_local = *(ctmbstr *)(name_local + 0x10);
  }
  return props;
}

Assistant:

static StyleProp *InsertProperty( TidyDocImpl* doc, StyleProp* props, ctmbstr name, ctmbstr value )
{
    StyleProp *first, *prev, *prop;
    int cmp;

    prev = NULL;
    first = props;

    while (props)
    {
        cmp = TY_(tmbstrcmp)(props->name, name);

        if (cmp == 0)
        {
            /* this property is already defined, ignore new value */
            return first;
        }

        if (cmp > 0)
        {
            /* insert before this */

            prop = (StyleProp *)TidyDocAlloc(doc, sizeof(StyleProp));
            prop->name = TY_(tmbstrdup)(doc->allocator, name);
            prop->value = TY_(tmbstrdup)(doc->allocator, value);
            prop->next = props;

            if (prev)
                prev->next = prop;
            else
                first = prop;

            return first;
        }

        prev = props;
        props = props->next;
    }

    prop = (StyleProp *)TidyDocAlloc(doc, sizeof(StyleProp));
    prop->name = TY_(tmbstrdup)(doc->allocator, name);
    prop->value = TY_(tmbstrdup)(doc->allocator, value);
    prop->next = NULL;

    if (prev)
        prev->next = prop;
    else
        first = prop;

    return first;
}